

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program.cpp
# Opt level: O1

bool __thiscall
Clasp::Asp::LogicProgram::simplifyNormal
          (LogicProgram *this,Head_t ht,AtomSpan *head,LitSpan *body,RuleBuilder *out,SRule *meta)

{
  AtomState *this_00;
  byte *pbVar1;
  uint uVar2;
  size_t sVar3;
  int *piVar4;
  PrgNode PVar5;
  bool bVar6;
  uint uVar7;
  uint32 uVar8;
  PrgAtom *pPVar9;
  Lit_t *pLVar10;
  byte bVar11;
  long lVar12;
  uint v;
  bool bVar13;
  uint32 size;
  uint uVar14;
  uint uVar15;
  char cVar16;
  bool bVar17;
  LitSpan LVar18;
  
  Potassco::RuleBuilder::clear(out);
  Potassco::RuleBuilder::startBody(out);
  meta->hash = 0;
  meta->pos = 0;
  meta->bid = 0x40000000;
  sVar3 = body->size;
  if (sVar3 == 0) {
    bVar6 = true;
  }
  else {
    piVar4 = body->first;
    this_00 = &this->atomState_;
    lVar12 = 0;
    bVar13 = true;
    do {
      uVar15 = *(uint *)((long)piVar4 + lVar12);
      uVar7 = -uVar15;
      if (0 < (int)uVar15) {
        uVar7 = uVar15;
      }
      if (0xfffffff < uVar7) {
        Potassco::fail(0x4b,
                       "bool Clasp::Asp::LogicProgram::simplifyNormal(Head_t, const Potassco::AtomSpan &, const Potassco::LitSpan &, RuleBuilder &, SRule &)"
                       ,0x712,"Potassco::atom(*it) < bodyId","Atom out of bounds",0);
      }
      pPVar9 = resize(this,uVar7);
      PVar5 = (pPVar9->super_PrgHead).super_PrgNode;
      uVar15 = *(uint *)((long)piVar4 + lVar12);
      uVar7 = uVar15 >> 0x1e;
      bVar11 = PVar5._7_1_ >> 4 & 3;
      if (((ulong)PVar5 >> 0x3e & 1) == 0 && bVar11 == 0) {
        cVar16 = '\0';
      }
      else {
        cVar16 = '\x02';
        if ((bVar11 != 2 && ((ulong)PVar5 >> 0x3e & 1) == 0) == ((uVar7 & 2) == 0)) {
          cVar16 = (PVar5._7_1_ >> 4 & 3) != 3;
        }
      }
      bVar17 = true;
      if (cVar16 == '\x02') {
        bVar6 = false;
      }
      else {
        uVar14 = (uint)((ulong)PVar5 >> 0x1e) & 0x3ffffffc;
        v = uVar14 >> 2;
        uVar2 = (this->atomState_).state_.ebo_.size;
        if ((uVar2 <= v) ||
           (bVar6 = false, ((this_00->state_).ebo_.buf[v] & ((uVar7 & 0xfffffffe) == 0) + 1U) == 0))
        {
          if ((cVar16 != '\x01') &&
             ((uVar2 <= v ||
              (((this_00->state_).ebo_.buf[v] & 2U - ((uVar7 & 0xfffffffe) == 0)) == 0)))) {
            bVar6 = (uVar7 & 2) != 0;
            uVar2 = -v;
            if (!bVar6) {
              uVar2 = v;
            }
            AtomState::set(this_00,v,bVar6 + '\x01');
            Potassco::RuleBuilder::addGoal(out,(WeightLit_t)((ulong)uVar2 | 0x100000000));
            meta->pos = meta->pos - ((int)~uVar15 >> 0x1f);
            uVar15 = (uVar14 | uVar7) >> 1;
            uVar15 = uVar15 * 0x8000 + ~uVar15;
            uVar15 = (uVar15 >> 0xb ^ uVar15) * 9;
            uVar15 = (uVar15 >> 5 ^ uVar15) * 0x401;
            meta->hash = meta->hash + (uVar15 >> 0x10 ^ uVar15);
          }
          bVar17 = false;
          bVar6 = bVar13;
        }
      }
    } while ((!bVar17) &&
            (bVar17 = sVar3 * 4 + -4 != lVar12, lVar12 = lVar12 + 4, bVar13 = bVar6, bVar17));
  }
  LVar18 = Potassco::RuleBuilder::body(out);
  size = (uint32)LVar18.size;
  if (bVar6) {
    uVar8 = findBody(this,meta->hash,(Body_t)0x0,size,-1,(WeightLit_t *)0x0);
    meta->bid = uVar8;
    bVar6 = pushHead(this,ht,head,0,out);
  }
  else {
    meta->bid = 0x40000000;
    bVar6 = false;
  }
  pLVar10 = Potassco::RuleBuilder::lits_begin(out);
  if (size != 0) {
    lVar12 = 0;
    do {
      uVar15 = pLVar10[lVar12];
      uVar7 = -uVar15;
      if (0 < (int)uVar15) {
        uVar7 = uVar15;
      }
      if (uVar7 < (this->atomState_).state_.ebo_.size) {
        pbVar1 = (this->atomState_).state_.ebo_.buf + uVar7;
        *pbVar1 = *pbVar1 & 0xe0;
      }
      lVar12 = lVar12 + 1;
    } while (size != (uint32)lVar12);
  }
  return bVar6;
}

Assistant:

bool LogicProgram::simplifyNormal(Head_t ht, const Potassco::AtomSpan& head, const Potassco::LitSpan& body, RuleBuilder& out, SRule& meta) {
	out.clear();
	out.startBody();
	meta = SRule();
	bool ok = true;
	for (Potassco::LitSpan::iterator it = Potassco::begin(body), end = Potassco::end(body); it != end; ++it) {
		POTASSCO_CHECK(Potassco::atom(*it) < bodyId, EOVERFLOW, "Atom out of bounds");
		PrgAtom* a = resize(Potassco::atom(*it));
		Literal  p = Literal(a->id(), *it < 0);// replace any eq atoms
		ValueRep v = litVal(a, !p.sign());
		if (v == value_false || atomState_.inBody(~p)) {
			ok = false;
			break;
		}
		else if (v != value_true  && !atomState_.inBody(p)) {
			atomState_.addToBody(p);
			out.addGoal(toInt(p));
			meta.pos  += !p.sign();
			meta.hash += hashLit(p);
		}
	}
	uint32_t bs = toU32(size(out.body()));
	meta.bid = ok ? findBody(meta.hash, Body_t::Normal, bs) : varMax;
	ok = ok && pushHead(ht, head, 0, out);
	for (const Potassco::Lit_t* it = out.lits_begin(); bs--;) {
		atomState_.clearRule(Potassco::atom(*it++));
	}
	return ok;
}